

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_utils.c
# Opt level: O1

int QuantizeLevels(uint8_t *data,int width,int height,int num_levels,uint64_t *sse)

{
  uint uVar1;
  double *pdVar2;
  byte bVar3;
  double dVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int q_level [256];
  int freq [256];
  double inv_q_level [256];
  double q_sum [256];
  double q_count [256];
  uint local_2038 [256];
  int local_1c38 [256];
  double local_1838 [256];
  double local_1038 [256];
  double local_838 [257];
  
  memset(local_1c38,0,0x400);
  memset(local_2038,0,0x400);
  memset(local_1838,0,0x800);
  iVar17 = 0;
  if ((data != (uint8_t *)0x0) &&
     (iVar17 = 0, 0xffffff00 < num_levels - 0x101U && (0 < height && 0 < width))) {
    iVar17 = height * width;
    lVar15 = (long)iVar17;
    if (iVar17 == 0) {
      uVar16 = 0xff;
      iVar6 = 0;
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      uVar16 = 0xff;
      lVar11 = 0;
      iVar6 = 0;
      do {
        bVar3 = data[lVar11];
        iVar6 = iVar6 + (uint)(local_1c38[bVar3] == 0);
        uVar13 = (uint)bVar3;
        if (bVar3 <= uVar16) {
          uVar16 = uVar13;
        }
        if ((uint)uVar8 <= uVar13) {
          uVar8 = (ulong)uVar13;
        }
        local_1c38[bVar3] = local_1c38[bVar3] + 1;
        lVar11 = lVar11 + 1;
      } while (lVar15 != lVar11);
    }
    if (num_levels < iVar6) {
      auVar19._8_4_ = iVar17 >> 0x1f;
      auVar19._0_8_ = lVar15;
      auVar19._12_4_ = 0x45300000;
      uVar13 = (uint)uVar8;
      if (0 < num_levels) {
        lVar11 = (ulong)(uint)num_levels - 1;
        auVar22._8_4_ = (int)lVar11;
        auVar22._0_8_ = lVar11;
        auVar22._12_4_ = (int)((ulong)lVar11 >> 0x20);
        uVar12 = 0;
        auVar22 = auVar22 ^ _DAT_001b7770;
        auVar23 = _DAT_001b6540;
        do {
          auVar24 = auVar23 ^ _DAT_001b7770;
          if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                      auVar22._4_4_ < auVar24._4_4_) & 1)) {
            local_1838[uVar12] =
                 ((double)(int)uVar12 * (double)(int)(uVar13 - uVar16)) / (double)(num_levels + -1)
                 + (double)uVar16;
          }
          if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
              auVar24._12_4_ <= auVar22._12_4_) {
            local_1838[uVar12 + 1] =
                 ((double)((int)uVar12 + 1) * (double)(int)(uVar13 - uVar16)) /
                 (double)(num_levels + -1) + (double)uVar16;
          }
          uVar12 = uVar12 + 2;
          lVar11 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar11 + 2;
        } while ((num_levels + 1U & 0x3fe) != uVar12);
      }
      uVar12 = (ulong)uVar16;
      local_2038[uVar12] = 0;
      uVar1 = num_levels - 1;
      local_2038[uVar8] = uVar1;
      iVar6 = 0;
      uVar20 = 0x2a16a1b1;
      uVar21 = 0x47d2ced3;
      do {
        memset(local_1038,0,0x800);
        memset(local_838,0,0x800);
        if (uVar16 <= uVar13) {
          uVar10 = 0;
          uVar8 = uVar12;
          do {
            lVar11 = (long)(int)uVar10;
            uVar14 = uVar1;
            if ((int)uVar1 < (int)uVar10) {
              uVar14 = uVar10;
            }
            uVar9 = uVar10 - 1;
            do {
              uVar10 = uVar14;
              if ((int)uVar1 <= lVar11) break;
              pdVar2 = local_1838 + lVar11;
              lVar5 = lVar11 + 1;
              lVar11 = lVar11 + 1;
              uVar10 = uVar9 + 1;
              uVar9 = uVar10;
            } while (*pdVar2 + local_1838[lVar5] < (double)((int)uVar8 * 2));
            iVar7 = local_1c38[uVar8];
            if (0 < iVar7) {
              local_1038[(int)uVar10] = (double)((int)uVar8 * iVar7) + local_1038[(int)uVar10];
              local_838[(int)uVar10] = (double)iVar7 + local_838[(int)uVar10];
            }
            local_2038[uVar8] = uVar10;
            uVar8 = uVar8 + 1;
          } while (uVar13 + 1 != (int)uVar8);
        }
        if (2 < num_levels) {
          uVar8 = 1;
          do {
            if (0.0 < local_838[uVar8]) {
              local_1838[uVar8] = local_1038[uVar8] / local_838[uVar8];
            }
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
        dVar18 = 0.0;
        uVar8 = uVar12;
        iVar7 = (uVar13 + 1) - uVar16;
        if (uVar16 <= uVar13) {
          do {
            dVar4 = (double)(int)uVar8 - local_1838[(int)local_2038[uVar8]];
            dVar18 = dVar18 + (double)local_1c38[uVar8] * dVar4 * dVar4;
            iVar7 = iVar7 + -1;
            uVar8 = uVar8 + 1;
          } while (iVar7 != 0);
        }
        if ((double)CONCAT44(uVar21,uVar20) - dVar18 <
            ((auVar19._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar17) - 4503599627370496.0)) * 0.0001) break;
        iVar6 = iVar6 + 1;
        uVar20 = SUB84(dVar18,0);
        uVar21 = (undefined4)((ulong)dVar18 >> 0x20);
      } while (iVar6 != 6);
      if (uVar16 <= uVar13) {
        lVar11 = 0;
        do {
          *(char *)((long)local_1038 + lVar11 + uVar12) =
               (char)(int)(local_1838[(int)local_2038[uVar12 + lVar11]] + 0.5);
          lVar11 = lVar11 + 1;
        } while ((uVar13 - uVar16) + 1 != (int)lVar11);
      }
      if (iVar17 != 0) {
        lVar11 = 0;
        do {
          data[lVar11] = *(uint8_t *)((long)local_1038 + (ulong)data[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar15 != lVar11);
      }
      uVar8 = (long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18;
    }
    else {
      uVar8 = 0;
    }
    iVar17 = 1;
    if (sse != (uint64_t *)0x0) {
      *sse = uVar8;
    }
  }
  return iVar17;
}

Assistant:

int QuantizeLevels(uint8_t* const data, int width, int height,
                   int num_levels, uint64_t* const sse) {
  int freq[NUM_SYMBOLS] = { 0 };
  int q_level[NUM_SYMBOLS] = { 0 };
  double inv_q_level[NUM_SYMBOLS] = { 0 };
  int min_s = 255, max_s = 0;
  const size_t data_size = height * width;
  int i, num_levels_in, iter;
  double last_err = 1.e38, err = 0.;
  const double err_threshold = ERROR_THRESHOLD * data_size;

  if (data == NULL) {
    return 0;
  }

  if (width <= 0 || height <= 0) {
    return 0;
  }

  if (num_levels < 2 || num_levels > 256) {
    return 0;
  }

  {
    size_t n;
    num_levels_in = 0;
    for (n = 0; n < data_size; ++n) {
      num_levels_in += (freq[data[n]] == 0);
      if (min_s > data[n]) min_s = data[n];
      if (max_s < data[n]) max_s = data[n];
      ++freq[data[n]];
    }
  }

  if (num_levels_in <= num_levels) goto End;  // nothing to do!

  // Start with uniformly spread centroids.
  for (i = 0; i < num_levels; ++i) {
    inv_q_level[i] = min_s + (double)(max_s - min_s) * i / (num_levels - 1);
  }

  // Fixed values. Won't be changed.
  q_level[min_s] = 0;
  q_level[max_s] = num_levels - 1;
  assert(inv_q_level[0] == min_s);
  assert(inv_q_level[num_levels - 1] == max_s);

  // k-Means iterations.
  for (iter = 0; iter < MAX_ITER; ++iter) {
    double q_sum[NUM_SYMBOLS] = { 0 };
    double q_count[NUM_SYMBOLS] = { 0 };
    int s, slot = 0;

    // Assign classes to representatives.
    for (s = min_s; s <= max_s; ++s) {
      // Keep track of the nearest neighbour 'slot'
      while (slot < num_levels - 1 &&
             2 * s > inv_q_level[slot] + inv_q_level[slot + 1]) {
        ++slot;
      }
      if (freq[s] > 0) {
        q_sum[slot] += s * freq[s];
        q_count[slot] += freq[s];
      }
      q_level[s] = slot;
    }

    // Assign new representatives to classes.
    if (num_levels > 2) {
      for (slot = 1; slot < num_levels - 1; ++slot) {
        const double count = q_count[slot];
        if (count > 0.) {
          inv_q_level[slot] = q_sum[slot] / count;
        }
      }
    }

    // Compute convergence error.
    err = 0.;
    for (s = min_s; s <= max_s; ++s) {
      const double error = s - inv_q_level[q_level[s]];
      err += freq[s] * error * error;
    }

    // Check for convergence: we stop as soon as the error is no
    // longer improving.
    if (last_err - err < err_threshold) break;
    last_err = err;
  }

  // Remap the alpha plane to quantized values.
  {
    // double->int rounding operation can be costly, so we do it
    // once for all before remapping. We also perform the data[] -> slot
    // mapping, while at it (avoid one indirection in the final loop).
    uint8_t map[NUM_SYMBOLS];
    int s;
    size_t n;
    for (s = min_s; s <= max_s; ++s) {
      const int slot = q_level[s];
      map[s] = (uint8_t)(inv_q_level[slot] + .5);
    }
    // Final pass.
    for (n = 0; n < data_size; ++n) {
      data[n] = map[data[n]];
    }
  }
 End:
  // Store sum of squared error if needed.
  if (sse != NULL) *sse = (uint64_t)err;

  return 1;
}